

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_link(void)

{
  ssize_t sVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_fs_t *req_00;
  uv_fs_t *unaff_R14;
  uv_buf_t uVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  uv_fs_t uStackY_3e0;
  uv_loop_t *puStackY_220;
  uv_fs_t *puStackY_218;
  undefined8 uStackY_208;
  code *pcStackY_200;
  undefined1 local_1e0 [8];
  uv_loop_t *local_180;
  
  puVar3 = (uv_loop_t *)0x1faf5d;
  pcStackY_200 = (code *)0x18f185;
  unlink("test_file");
  pcStackY_200 = (code *)0x18f191;
  unlink("test_file_link");
  pcStackY_200 = (code *)0x18f19d;
  unlink("test_file_link2");
  pcStackY_200 = (code *)0x18f1a2;
  loop = uv_default_loop();
  pcStackY_200 = (code *)0x18f1c6;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar4 = local_180;
  local_1e0 = (undefined1  [8])(long)iVar2;
  if (local_1e0 == (undefined1  [8])0x0) {
    local_1e0 = (undefined1  [8])local_180;
    puVar3 = local_180;
    if ((long)local_180 < 0) goto LAB_0018f724;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f216;
    uv_fs_req_cleanup(unaff_R14);
    pcStackY_200 = (code *)0x18f227;
    iov = uv_buf_init(test_buf,0xd);
    pcStackY_200 = (code *)0x18f25d;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,unaff_R14,(uv_os_fd_t)puVar4,&iov,1,-1,(uv_fs_cb)0x0);
    local_1e0 = (undefined1  [8])(long)iVar2;
    puVar3 = puVar4;
    if (local_1e0 != (undefined1  [8])0xd) goto LAB_0018f733;
    local_1e0 = (undefined1  [8])local_180;
    if (local_180 != (uv_loop_t *)0xd) goto LAB_0018f742;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f2ad;
    uv_fs_req_cleanup(unaff_R14);
    pcStackY_200 = (code *)0x18f2bb;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,unaff_R14,(uv_os_fd_t)puVar4,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018f751;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_0018f756;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f2dc;
    uv_fs_req_cleanup((uv_fs_t *)puVar3);
    pcStackY_200 = (code *)0x18f2f7;
    iVar2 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)puVar3,"test_file","test_file_link",(uv_fs_cb)0x0
                      );
    local_1e0 = (undefined1  [8])(long)iVar2;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f75b;
    local_1e0 = (undefined1  [8])local_180;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_0018f76a;
    pcStackY_200 = (code *)0x18f347;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    pcStackY_200 = (code *)0x18f363;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file_link",2,0,
                       (uv_fs_cb)0x0);
    puVar4 = local_180;
    local_1e0 = (undefined1  [8])(long)iVar2;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffe28;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f779;
    local_1e0 = (undefined1  [8])local_180;
    if ((long)local_180 < 0) goto LAB_0018f788;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f3b3;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_200 = (code *)0x18f3d5;
    uVar5 = uv_buf_init(buf,0x20);
    pcStackY_200 = (code *)0x18f406;
    iov = uVar5;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,unaff_R14,(uv_os_fd_t)puVar4,&iov,1,0,(uv_fs_cb)0x0);
    local_1e0 = (undefined1  [8])(long)iVar2;
    if ((long)local_1e0 < 0) goto LAB_0018f797;
    local_1e0 = (undefined1  [8])local_180;
    if ((long)local_180 < 0) goto LAB_0018f7a6;
    pcStackY_200 = (code *)0x18f458;
    iVar2 = strcmp(buf,test_buf);
    local_1e0 = (undefined1  [8])(long)iVar2;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f7b5;
    pcStackY_200 = (code *)0x18f488;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_os_fd_t)puVar4,
                        (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018f7c4;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_0018f7c9;
    puVar4 = (uv_loop_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f4a9;
    uv_fs_req_cleanup((uv_fs_t *)puVar4);
    pcStackY_200 = (code *)0x18f4cd;
    iVar2 = uv_fs_link(loop,(uv_fs_t *)puVar4,"test_file","test_file_link2",link_cb);
    local_1e0 = (undefined1  [8])(long)iVar2;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f7ce;
    pcStackY_200 = (code *)0x18f4fb;
    uv_run(loop,UV_RUN_DEFAULT);
    local_1e0 = (undefined1  [8])0x1;
    if (link_cb_count != 1) goto LAB_0018f7dd;
    pcStackY_200 = (code *)0x18f53e;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,"test_file_link2",2,0,
                       (uv_fs_cb)0x0);
    puVar3 = local_180;
    local_1e0 = (undefined1  [8])(long)iVar2;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f7ec;
    local_1e0 = (undefined1  [8])local_180;
    if ((long)local_180 < 0) goto LAB_0018f7fb;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe28;
    pcStackY_200 = (code *)0x18f58e;
    uv_fs_req_cleanup(unaff_R14);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_200 = (code *)0x18f5b0;
    uVar5 = uv_buf_init(buf,0x20);
    pcStackY_200 = (code *)0x18f5e1;
    iov = uVar5;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,unaff_R14,(uv_os_fd_t)puVar3,&iov,1,0,(uv_fs_cb)0x0);
    local_1e0 = (undefined1  [8])(long)iVar2;
    if ((long)local_1e0 < 0) goto LAB_0018f80a;
    local_1e0 = (undefined1  [8])local_180;
    if ((long)local_180 < 0) goto LAB_0018f819;
    pcStackY_200 = (code *)0x18f633;
    iVar2 = strcmp(buf,test_buf);
    local_1e0 = (undefined1  [8])(long)iVar2;
    if (local_1e0 != (undefined1  [8])0x0) goto LAB_0018f828;
    pcStackY_200 = (code *)0x18f663;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe28,(uv_os_fd_t)puVar3,
                        (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018f837;
    if (local_180 != (uv_loop_t *)0x0) goto LAB_0018f83c;
    pcStackY_200 = (code *)0x18f681;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe28);
    pcStackY_200 = (code *)0x18f68f;
    uv_run(loop,UV_RUN_DEFAULT);
    pcStackY_200 = (code *)0x18f69b;
    unlink("test_file");
    pcStackY_200 = (code *)0x18f6a7;
    unlink("test_file_link");
    pcStackY_200 = (code *)0x18f6b3;
    unlink("test_file_link2");
    puVar3 = loop;
    pcStackY_200 = (code *)0x18f6cb;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    pcStackY_200 = (code *)0x18f6d5;
    uv_run(puVar3,UV_RUN_DEFAULT);
    local_1e0 = (undefined1  [8])0x0;
    pcStackY_200 = (code *)0x18f6ea;
    iVar2 = uv_loop_close(loop);
    if (local_1e0 == (undefined1  [8])(long)iVar2) {
      pcStackY_200 = (code *)0x18f706;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStackY_200 = (code *)0x18f724;
    run_test_fs_link_cold_1();
LAB_0018f724:
    pcStackY_200 = (code *)0x18f733;
    run_test_fs_link_cold_25();
LAB_0018f733:
    pcStackY_200 = (code *)0x18f742;
    run_test_fs_link_cold_2();
LAB_0018f742:
    pcStackY_200 = (code *)0x18f751;
    run_test_fs_link_cold_3();
LAB_0018f751:
    pcStackY_200 = (code *)0x18f756;
    run_test_fs_link_cold_4();
LAB_0018f756:
    pcStackY_200 = (code *)0x18f75b;
    run_test_fs_link_cold_5();
LAB_0018f75b:
    pcStackY_200 = (code *)0x18f76a;
    run_test_fs_link_cold_6();
LAB_0018f76a:
    pcStackY_200 = (code *)0x18f779;
    run_test_fs_link_cold_7();
LAB_0018f779:
    puVar4 = puVar3;
    pcStackY_200 = (code *)0x18f788;
    run_test_fs_link_cold_8();
LAB_0018f788:
    pcStackY_200 = (code *)0x18f797;
    run_test_fs_link_cold_24();
LAB_0018f797:
    pcStackY_200 = (code *)0x18f7a6;
    run_test_fs_link_cold_23();
LAB_0018f7a6:
    pcStackY_200 = (code *)0x18f7b5;
    run_test_fs_link_cold_22();
LAB_0018f7b5:
    pcStackY_200 = (code *)0x18f7c4;
    run_test_fs_link_cold_9();
LAB_0018f7c4:
    pcStackY_200 = (code *)0x18f7c9;
    run_test_fs_link_cold_10();
LAB_0018f7c9:
    pcStackY_200 = (code *)0x18f7ce;
    run_test_fs_link_cold_11();
LAB_0018f7ce:
    pcStackY_200 = (code *)0x18f7dd;
    run_test_fs_link_cold_12();
LAB_0018f7dd:
    pcStackY_200 = (code *)0x18f7ec;
    run_test_fs_link_cold_13();
LAB_0018f7ec:
    puVar3 = puVar4;
    pcStackY_200 = (code *)0x18f7fb;
    run_test_fs_link_cold_14();
LAB_0018f7fb:
    pcStackY_200 = (code *)0x18f80a;
    run_test_fs_link_cold_21();
LAB_0018f80a:
    pcStackY_200 = (code *)0x18f819;
    run_test_fs_link_cold_20();
LAB_0018f819:
    pcStackY_200 = (code *)0x18f828;
    run_test_fs_link_cold_19();
LAB_0018f828:
    pcStackY_200 = (code *)0x18f837;
    run_test_fs_link_cold_15();
LAB_0018f837:
    pcStackY_200 = (code *)0x18f83c;
    run_test_fs_link_cold_16();
LAB_0018f83c:
    pcStackY_200 = (code *)0x18f841;
    run_test_fs_link_cold_17();
  }
  req_00 = (uv_fs_t *)local_1e0;
  pcStackY_200 = link_cb;
  run_test_fs_link_cold_18();
  pcStackY_200 = (code *)(long)req_00->fs_type;
  uStackY_208 = 0x17;
  if (pcStackY_200 == (code *)0x17) {
    pcStackY_200 = (code *)req_00->result;
    uStackY_208 = 0;
    if (pcStackY_200 == (code *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup(req_00);
      return extraout_EAX;
    }
  }
  else {
    puStackY_218 = (uv_fs_t *)0x18f8ae;
    link_cb_cold_1();
  }
  puStackY_218 = (uv_fs_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_220 = puVar3;
  puStackY_218 = unaff_R14;
  loop = uv_default_loop();
  iVar2 = uv_fs_readlink(loop,&uStackY_3e0,"no_such_file",dummy_cb);
  if (iVar2 == 0) {
    iVar2 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0018fb93;
    if (dummy_cb_count != 1) goto LAB_0018fba2;
    if (uStackY_3e0.ptr != (void *)0x0) goto LAB_0018fbb1;
    if (uStackY_3e0.result != -2) goto LAB_0018fbb6;
    uv_fs_req_cleanup(&uStackY_3e0);
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_3e0,"no_such_file",(uv_fs_cb)0x0);
    if (iVar2 != -2) goto LAB_0018fbc5;
    if (uStackY_3e0.ptr != (void *)0x0) goto LAB_0018fbd4;
    if (uStackY_3e0.result != -2) goto LAB_0018fbd9;
    uv_fs_req_cleanup(&uStackY_3e0);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStackY_3e0,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    sVar1 = uStackY_3e0.result;
    if (iVar2 != 0) goto LAB_0018fbe8;
    if (uStackY_3e0.result < 0) goto LAB_0018fbf7;
    uv_fs_req_cleanup(&uStackY_3e0);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStackY_3e0,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0018fc06;
    if (uStackY_3e0.result != 0) goto LAB_0018fc15;
    uv_fs_req_cleanup(&uStackY_3e0);
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_3e0,"test_file",(uv_fs_cb)0x0);
    if (iVar2 == -0x16) {
      uv_fs_req_cleanup(&uStackY_3e0);
      unlink("test_file");
      puVar3 = loop;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      uStackY_3e0.data = (void *)0x0;
      iVar2 = uv_loop_close(loop);
      if (uStackY_3e0.data == (void *)(long)iVar2) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018fc33;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_0018fb93:
    run_test_fs_readlink_cold_2();
LAB_0018fba2:
    run_test_fs_readlink_cold_3();
LAB_0018fbb1:
    run_test_fs_readlink_cold_4();
LAB_0018fbb6:
    run_test_fs_readlink_cold_5();
LAB_0018fbc5:
    run_test_fs_readlink_cold_6();
LAB_0018fbd4:
    run_test_fs_readlink_cold_7();
LAB_0018fbd9:
    run_test_fs_readlink_cold_8();
LAB_0018fbe8:
    run_test_fs_readlink_cold_9();
LAB_0018fbf7:
    run_test_fs_readlink_cold_14();
LAB_0018fc06:
    run_test_fs_readlink_cold_10();
LAB_0018fc15:
    run_test_fs_readlink_cold_11();
  }
  run_test_fs_readlink_cold_12();
LAB_0018fc33:
  run_test_fs_readlink_cold_13();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_os_fd_t file;
  uv_os_fd_t link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", UV_FS_O_RDWR | UV_FS_O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT_EQ(r, sizeof(test_buf));
  ASSERT_EQ(req.result, sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, link_cb_count);

  r = uv_fs_open(NULL, &req, "test_file_link2", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}